

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

CPAccessResult gt_stimer_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  _Bool _Var1;
  int iVar2;
  _Bool isread_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_current_el(env);
  switch(iVar2) {
  case 0:
  case 2:
    env_local._4_4_ = CP_ACCESS_TRAP;
    break;
  case 1:
    _Var1 = arm_is_secure(env);
    if (_Var1) {
      if (((env->cp15).scr_el3 & 0x800) == 0) {
        env_local._4_4_ = CP_ACCESS_TRAP_EL3;
      }
      else {
        env_local._4_4_ = CP_ACCESS_OK;
      }
    }
    else {
      env_local._4_4_ = CP_ACCESS_TRAP;
    }
    break;
  case 3:
    env_local._4_4_ = CP_ACCESS_OK;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x8da,(char *)0x0);
  }
  return env_local._4_4_;
}

Assistant:

static CPAccessResult gt_stimer_access(CPUARMState *env,
                                       const ARMCPRegInfo *ri,
                                       bool isread)
{
    /* The AArch64 register view of the secure physical timer is
     * always accessible from EL3, and configurably accessible from
     * Secure EL1.
     */
    switch (arm_current_el(env)) {
    case 1:
        if (!arm_is_secure(env)) {
            return CP_ACCESS_TRAP;
        }
        if (!(env->cp15.scr_el3 & SCR_ST)) {
            return CP_ACCESS_TRAP_EL3;
        }
        return CP_ACCESS_OK;
    case 0:
    case 2:
        return CP_ACCESS_TRAP;
    case 3:
        return CP_ACCESS_OK;
    default:
        g_assert_not_reached();
        // never reach here
        return CP_ACCESS_OK;
    }
}